

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O3

ggml_float ggml_vec_soft_max_f32(int n,float *y,float *x,float max)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  float fVar25;
  undefined8 extraout_XMM0_Qb;
  undefined1 in_register_00001204 [60];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ggml_float gVar30;
  undefined1 auVar31 [16];
  undefined1 in_ZMM20 [64];
  undefined1 auVar32 [64];
  ulong local_40;
  
  auVar26._4_60_ = in_register_00001204;
  auVar26._0_4_ = max;
  auVar5 = in_ZMM20._0_16_;
  if (n < 0x10) {
    auVar5 = vxorpd_avx512vl(auVar5,auVar5);
    auVar32 = ZEXT1664(auVar5);
    uVar4 = 0;
  }
  else {
    auVar7 = vbroadcastss_avx512f(ZEXT416(0xcb400000));
    auVar8 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
    auVar9 = vbroadcastss_avx512f(ZEXT416(0xbf317200));
    auVar10 = vbroadcastss_avx512f(ZEXT416(0xb5bfbe8e));
    auVar11 = vbroadcastss_avx512f(ZEXT416(0x43400000));
    auVar12 = vbroadcastss_avx512f(ZEXT416(0x3c072010));
    auVar13 = vbroadcastss_avx512f(ZEXT416(0x3d2b9f17));
    auVar14 = vbroadcastss_avx512f(ZEXT416(0x3e2aaf33));
    auVar15 = vbroadcastss_avx512f(ZEXT416(0x3efffedb));
    auVar16 = vbroadcastss_avx512f(ZEXT416(0x3f7ffff6));
    auVar17 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar18 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
    auVar19 = vbroadcastss_avx512f(auVar26._0_16_);
    auVar5 = vxorpd_avx512vl(auVar5,auVar5);
    auVar32 = ZEXT1664(auVar5);
    uVar2 = 0;
    do {
      auVar20 = vsubps_avx512f(*(undefined1 (*) [64])(x + uVar2),auVar19);
      auVar21 = vfmsub231ps_avx512f(auVar7,auVar20,auVar8);
      auVar21 = vaddps_avx512f(auVar21,auVar7);
      auVar20 = vfmadd231ps_avx512f(auVar20,auVar21,auVar9);
      auVar22 = vandps_avx512dq(auVar21,auVar18);
      uVar4 = vcmpps_avx512f(auVar22,auVar11,0xe);
      auVar20 = vfmadd231ps_avx512f(auVar20,auVar21,auVar10);
      auVar22 = vfmadd213ps_avx512f(auVar12,auVar20,auVar13);
      auVar23 = vfmadd213ps_avx512f(auVar14,auVar20,auVar15);
      auVar24 = vmulps_avx512f(auVar20,auVar20);
      auVar20 = vfmadd213ps_avx512f(auVar20,auVar16,auVar17);
      auVar22 = vfmadd231ps_avx512f(auVar23,auVar24,auVar22);
      auVar20 = vfmadd231ps_avx512f(auVar20,auVar24,auVar22);
      auVar22 = vscalefps_avx512f(auVar20,auVar21);
      auVar20 = auVar22;
      if ((short)uVar4 != 0) {
        uVar3 = vcmpps_avx512f(auVar21,ZEXT1664(ZEXT816(0) << 0x40),6);
        auVar21 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
        bVar1 = (bool)((byte)uVar4 & 1);
        auVar20._0_4_ =
             (uint)bVar1 * (uint)((byte)uVar3 & 1) * auVar21._0_4_ | (uint)!bVar1 * auVar22._0_4_;
        bVar1 = (bool)((byte)(uVar4 >> 1) & 1);
        auVar20._4_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 1) & 1) * auVar21._4_4_ |
             (uint)!bVar1 * auVar22._4_4_;
        bVar1 = (bool)((byte)(uVar4 >> 2) & 1);
        auVar20._8_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 2) & 1) * auVar21._8_4_ |
             (uint)!bVar1 * auVar22._8_4_;
        bVar1 = (bool)((byte)(uVar4 >> 3) & 1);
        auVar20._12_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 3) & 1) * auVar21._12_4_ |
             (uint)!bVar1 * auVar22._12_4_;
        bVar1 = (bool)((byte)(uVar4 >> 4) & 1);
        auVar20._16_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 4) & 1) * auVar21._16_4_ |
             (uint)!bVar1 * auVar22._16_4_;
        bVar1 = (bool)((byte)(uVar4 >> 5) & 1);
        auVar20._20_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 5) & 1) * auVar21._20_4_ |
             (uint)!bVar1 * auVar22._20_4_;
        bVar1 = (bool)((byte)(uVar4 >> 6) & 1);
        auVar20._24_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 6) & 1) * auVar21._24_4_ |
             (uint)!bVar1 * auVar22._24_4_;
        bVar1 = (bool)((byte)(uVar4 >> 7) & 1);
        auVar20._28_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 7) & 1) * auVar21._28_4_ |
             (uint)!bVar1 * auVar22._28_4_;
        bVar1 = (bool)((byte)(uVar4 >> 8) & 1);
        auVar20._32_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 8) & 1) * auVar21._32_4_ |
             (uint)!bVar1 * auVar22._32_4_;
        bVar1 = (bool)((byte)(uVar4 >> 9) & 1);
        auVar20._36_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 9) & 1) * auVar21._36_4_ |
             (uint)!bVar1 * auVar22._36_4_;
        bVar1 = (bool)((byte)(uVar4 >> 10) & 1);
        auVar20._40_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 10) & 1) * auVar21._40_4_ |
             (uint)!bVar1 * auVar22._40_4_;
        bVar1 = (bool)((byte)(uVar4 >> 0xb) & 1);
        auVar20._44_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 0xb) & 1) * auVar21._44_4_ |
             (uint)!bVar1 * auVar22._44_4_;
        bVar1 = (bool)((byte)(uVar4 >> 0xc) & 1);
        auVar20._48_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 0xc) & 1) * auVar21._48_4_ |
             (uint)!bVar1 * auVar22._48_4_;
        bVar1 = (bool)((byte)(uVar4 >> 0xd) & 1);
        auVar20._52_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 0xd) & 1) * auVar21._52_4_ |
             (uint)!bVar1 * auVar22._52_4_;
        bVar1 = (bool)((byte)(uVar4 >> 0xe) & 1);
        auVar20._56_4_ =
             (uint)bVar1 * (uint)((byte)(uVar3 >> 0xe) & 1) * auVar21._56_4_ |
             (uint)!bVar1 * auVar22._56_4_;
        bVar1 = SUB81(uVar4 >> 0xf,0);
        auVar20._60_4_ =
             (uint)bVar1 * (uint)(byte)(uVar3 >> 0xf) * auVar21._60_4_ |
             (uint)!bVar1 * auVar22._60_4_;
      }
      auVar6 = vextractf64x4_avx512f(auVar20,1);
      *(undefined1 (*) [64])(y + uVar2) = auVar20;
      uVar4 = uVar2 + 0x10;
      uVar3 = uVar2 + 0x1f;
      auVar20 = vaddps_avx512f(auVar20,ZEXT3264(auVar6));
      auVar27._0_4_ = auVar20._0_4_ + auVar20._16_4_;
      auVar27._4_4_ = auVar20._4_4_ + auVar20._20_4_;
      auVar27._8_4_ = auVar20._8_4_ + auVar20._24_4_;
      auVar27._12_4_ = auVar20._12_4_ + auVar20._28_4_;
      auVar5 = vshufpd_avx(auVar27,auVar27,1);
      auVar28._0_4_ = auVar27._0_4_ + auVar5._0_4_;
      auVar28._4_4_ = auVar27._4_4_ + auVar5._4_4_;
      auVar28._8_4_ = auVar27._8_4_ + auVar5._8_4_;
      auVar28._12_4_ = auVar27._12_4_ + auVar5._12_4_;
      auVar5 = vhaddps_avx(auVar28,auVar28);
      auVar29._0_8_ = (double)auVar5._0_4_;
      auVar29._8_8_ = auVar5._8_8_;
      auVar5 = vaddsd_avx512f(auVar32._0_16_,auVar29);
      auVar32 = ZEXT1664(auVar5);
      uVar2 = uVar4;
    } while (uVar3 < (uint)n);
  }
  gVar30 = auVar32._0_8_;
  if ((int)uVar4 < n) {
    uVar4 = uVar4 & 0xffffffff;
    do {
      vmovsd_avx512f(auVar32._0_16_);
      auVar5 = vsubss_avx512f(ZEXT416((uint)x[uVar4]),auVar26._0_16_);
      fVar25 = expf(auVar5._0_4_);
      auVar5._0_8_ = (double)fVar25;
      auVar5._8_8_ = extraout_XMM0_Qb;
      y[uVar4] = fVar25;
      uVar4 = uVar4 + 1;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_40;
      auVar5 = vaddsd_avx512f(auVar31,auVar5);
      gVar30 = auVar5._0_8_;
      auVar32 = ZEXT1664(auVar5);
    } while ((uint)n != uVar4);
  }
  return gVar30;
}

Assistant:

ggml_float ggml_vec_soft_max_f32(const int n, float * y, const float * x, float max) {
    int i = 0;
    ggml_float sum = 0;
#if defined(__AVX512F__) && defined(__AVX512DQ__)
    for (; i + 15 < n; i += 16) {
        __m512 val = ggml_v_expf(_mm512_sub_ps(_mm512_loadu_ps(x + i),
                                               _mm512_set1_ps(max)));
        _mm512_storeu_ps(y + i, val);
        sum += (ggml_float)_mm512_reduce_add_ps(val);
    }
#elif defined(__AVX2__) && defined(__FMA__)
    for (; i + 7 < n; i += 8) {
        __m256 val = ggml_v_expf(_mm256_sub_ps(_mm256_loadu_ps(x + i),
                                               _mm256_set1_ps(max)));
        _mm256_storeu_ps(y + i, val);
        __m128 val2 = _mm_add_ps(_mm256_extractf128_ps(val, 1),
                                 _mm256_castps256_ps128(val));
        val2 = _mm_add_ps(val2, _mm_movehl_ps(val2, val2));
        val2 = _mm_add_ss(val2, _mm_movehdup_ps(val2));
        sum += (ggml_float)_mm_cvtss_f32(val2);
    }
#elif defined(__SSE2__)
    for (; i + 3 < n; i += 4) {
        __m128 val = ggml_v_expf(_mm_sub_ps(_mm_loadu_ps(x + i),
                                            _mm_set1_ps(max)));
        _mm_storeu_ps(y + i, val);
#if defined(__AVX__) || defined(__AVX2__) || defined(__AVX512F__)
        val = _mm_add_ps(val, _mm_movehl_ps(val, val));
        val = _mm_add_ss(val, _mm_movehdup_ps(val));
#else
        __m128 tmp = _mm_shuffle_ps(val, val, _MM_SHUFFLE(2, 3, 0, 1));
        val = _mm_add_ps(val, tmp);
        tmp = _mm_movehl_ps(tmp, val);
        val = _mm_add_ss(val, tmp);
#endif
        sum += (ggml_float)_mm_cvtss_f32(val);
    }
#elif defined(__ARM_NEON) && defined(__aarch64__)
    for (; i + 3 < n; i += 4) {
        float32x4_t val = ggml_v_expf(vsubq_f32(vld1q_f32(x + i),
                                                vdupq_n_f32(max)));
        vst1q_f32(y + i, val);
        sum += (ggml_float)vaddvq_f32(val);
    }
#endif
    for (; i < n; ++i) {
        float val = expf(x[i] - max);
        sum += (ggml_float)val;
        y[i] = val;
    }
    return sum;
}